

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O2

FPropertyInfo * FindProperty(char *string)

{
  FPropertyInfo *pFVar1;
  FPropertyInfo **ppFVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  ppFVar2 = properties.Array;
  iVar6 = properties.Count - 1;
  iVar5 = 0;
  while( true ) {
    if (iVar6 < iVar5) {
      return (FPropertyInfo *)0x0;
    }
    uVar4 = (uint)(iVar6 + iVar5) >> 1;
    pFVar1 = ppFVar2[uVar4];
    iVar3 = strcasecmp(string,pFVar1->name);
    if (iVar3 == 0) break;
    if (iVar3 < 1) {
      iVar6 = uVar4 - 1;
    }
    else {
      iVar5 = uVar4 + 1;
    }
  }
  return pFVar1;
}

Assistant:

FPropertyInfo *FindProperty(const char * string)
{
	int min = 0, max = properties.Size()-1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lexval = stricmp (string, properties[mid]->name);
		if (lexval == 0)
		{
			return properties[mid];
		}
		else if (lexval > 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}